

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O1

bool __thiscall
glcts::ViewportArray::DrawTestBase::checkRegionR32I
          (DrawTestBase *this,GLuint x,GLuint y,GLuint width,GLuint height,GLint expected_value,
          GLint *data)

{
  ostringstream *this_00;
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  GLuint GVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  if (height == 0) {
    bVar2 = true;
  }
  else {
    this_00 = (ostringstream *)(local_1b0 + 8);
    uVar3 = y * height * 0x80 + width * x;
    GVar5 = 0;
    bVar2 = true;
    do {
      bVar7 = width != 0;
      if (width != 0) {
        uVar6 = 1;
        uVar4 = uVar3;
        do {
          iVar1 = data[uVar4];
          if (iVar1 != expected_value) {
            local_1b0._0_8_ = ((this->super_TestCaseBase).m_context)->m_testCtx->m_log;
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"Invalid result. Region (",0x18);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"x",1);
            std::ostream::_M_insert<unsigned_long>((ulong)this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"). Expected: ",0xd);
            std::ostream::operator<<(this_00,expected_value);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," got ",5);
            std::ostream::operator<<(this_00,iVar1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this_00);
            std::ios_base::~ios_base(local_138);
            bVar2 = false;
            break;
          }
          bVar7 = uVar6 < width;
          uVar4 = uVar4 + 1;
          bVar8 = uVar6 != width;
          uVar6 = uVar6 + 1;
        } while (bVar8);
      }
      if (bVar7) {
        return bVar2;
      }
      GVar5 = GVar5 + 1;
      uVar3 = uVar3 + 0x80;
    } while (GVar5 != height);
  }
  return bVar2;
}

Assistant:

bool DrawTestBase::checkRegionR32I(GLuint x, GLuint y, GLuint width, GLuint height, GLint expected_value, GLint* data)
{
	bool result = true;

	const GLuint offset = (y * height * m_width) + (x * width);

	for (GLuint line = 0; line < height; ++line)
	{
		const GLuint line_offset = offset + line * m_width;

		for (GLuint texel = 0; texel < width; ++texel)
		{
			const GLuint texel_offset = line_offset + texel;

			const GLint value = data[texel_offset];

			if (expected_value != value)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid result. Region (" << x << "x"
													<< y << "). Expected: " << expected_value << " got " << value
													<< tcu::TestLog::EndMessage;

				result = false;
				goto end;
			}
		}
	}

end:
	return result;
}